

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrintColorEncoded(char *str)

{
  char cVar1;
  char *pcVar2;
  char *in_RDI;
  char ch;
  char *p;
  GTestColor color;
  String *this;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  String local_28;
  char *local_18;
  uint local_c;
  char *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  while (local_18 = strchr(local_8,0x40), local_18 != (char *)0x0) {
    this = &local_28;
    uVar3 = local_c;
    String::String((String *)CONCAT44(local_c,in_stack_ffffffffffffffc0),(char *)this,0x1fb91c);
    pcVar2 = String::c_str(this);
    ColoredPrintf((GTestColor)(ulong)uVar3,"%s",pcVar2);
    String::~String((String *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    cVar1 = local_18[1];
    local_8 = local_18 + 2;
    if (cVar1 == '@') {
      ColoredPrintf((GTestColor)(ulong)local_c,"@");
    }
    else if (cVar1 == 'D') {
      local_c = 0;
    }
    else if (cVar1 == 'R') {
      local_c = 1;
    }
    else if (cVar1 == 'G') {
      local_c = 2;
    }
    else if (cVar1 == 'Y') {
      local_c = 3;
    }
    else {
      local_8 = local_18 + 1;
    }
  }
  ColoredPrintf((GTestColor)(ulong)local_c,"%s",local_8);
  return;
}

Assistant:

static void PrintColorEncoded(const char* str) {
  GTestColor color = COLOR_DEFAULT;  // The current color.

  // Conceptually, we split the string into segments divided by escape
  // sequences.  Then we print one segment at a time.  At the end of
  // each iteration, the str pointer advances to the beginning of the
  // next segment.
  for (;;) {
    const char* p = strchr(str, '@');
    if (p == NULL) {
      ColoredPrintf(color, "%s", str);
      return;
    }

    ColoredPrintf(color, "%s", String(str, p - str).c_str());

    const char ch = p[1];
    str = p + 2;
    if (ch == '@') {
      ColoredPrintf(color, "@");
    } else if (ch == 'D') {
      color = COLOR_DEFAULT;
    } else if (ch == 'R') {
      color = COLOR_RED;
    } else if (ch == 'G') {
      color = COLOR_GREEN;
    } else if (ch == 'Y') {
      color = COLOR_YELLOW;
    } else {
      --str;
    }
  }
}